

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

Vector<float,_4> __thiscall
deqp::gles3::Functional::swizzleVec<float>(Functional *this,Vector<float,_4> *vec,int swzNdx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  Vector<float,_4> VVar5;
  
  lVar4 = (long)(swzNdx % 8) * 0x10;
  VVar5.m_data[1] = 0.0;
  VVar5.m_data[0] = vec->m_data[*(int *)(s_swizzles + lVar4)];
  fVar1 = vec->m_data[*(int *)(s_swizzles + lVar4 + 4)];
  fVar2 = vec->m_data[*(int *)(s_swizzles + lVar4 + 8)];
  fVar3 = vec->m_data[*(int *)(s_swizzles + lVar4 + 0xc)];
  *(float *)this = vec->m_data[*(int *)(s_swizzles + lVar4)];
  *(float *)(this + 4) = fVar1;
  *(float *)(this + 8) = fVar2;
  *(float *)(this + 0xc) = fVar3;
  VVar5.m_data[2] = fVar1;
  VVar5.m_data[3] = 0.0;
  return (Vector<float,_4>)VVar5.m_data;
}

Assistant:

inline tcu::Vector<T, 4> swizzleVec (const tcu::Vector<T, 4>& vec, int swzNdx)
{
	const IVec4& swz = s_swizzles[swzNdx % DE_LENGTH_OF_ARRAY(s_swizzles)];
	return vec.swizzle(swz[0], swz[1], swz[2], swz[3]);
}